

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O0

int mraa_led_read_brightness(mraa_led_context dev)

{
  mraa_result_t mVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  char local_1b [3];
  mraa_led_context p_Stack_18;
  char buf [3];
  mraa_led_context dev_local;
  
  p_Stack_18 = dev;
  if (dev == (mraa_led_context)0x0) {
    syslog(3,"led: read_brightness: context is invalid");
    dev_local._4_4_ = 5;
  }
  else {
    if (dev->trig_fd != -1) {
      close(dev->trig_fd);
      p_Stack_18->trig_fd = -1;
    }
    if (p_Stack_18->max_bright_fd != -1) {
      close(p_Stack_18->max_bright_fd);
      p_Stack_18->max_bright_fd = -1;
    }
    if (p_Stack_18->bright_fd == -1) {
      mVar1 = mraa_led_get_brightfd(p_Stack_18);
      if (mVar1 != MRAA_SUCCESS) {
        return 7;
      }
    }
    else {
      lseek(p_Stack_18->bright_fd,0,0);
    }
    sVar2 = read(p_Stack_18->bright_fd,local_1b,3);
    if (sVar2 == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      syslog(3,"led: read_brightness: Failed to read \'brightness\': %s",pcVar4);
      dev_local._4_4_ = 99;
    }
    else {
      lseek(p_Stack_18->bright_fd,0,0);
      dev_local._4_4_ = atoi(local_1b);
    }
  }
  return dev_local._4_4_;
}

Assistant:

int
mraa_led_read_brightness(mraa_led_context dev)
{
    char buf[3];

    if (dev == NULL) {
        syslog(LOG_ERR, "led: read_brightness: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (dev->trig_fd != -1) {
        close(dev->trig_fd);
        dev->trig_fd = -1;
    }

    if (dev->max_bright_fd != -1) {
        close(dev->max_bright_fd);
        dev->max_bright_fd = -1;
    }

    if (dev->bright_fd == -1) {
        if (mraa_led_get_brightfd(dev) != MRAA_SUCCESS) {
            return MRAA_ERROR_INVALID_RESOURCE;
        }
    } else {
        lseek(dev->bright_fd, 0, SEEK_SET);
    }

    if (read(dev->bright_fd, buf, 3 * sizeof(char)) == -1) {
        syslog(LOG_ERR, "led: read_brightness: Failed to read 'brightness': %s", strerror(errno));
        return MRAA_ERROR_UNSPECIFIED;
    }
    lseek(dev->bright_fd, 0, SEEK_SET);

    return (int) atoi(buf);
}